

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void cortex_a7_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  ARMCPU *cpu;
  
  obj[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)((ulong)obj[1].tb_jmp_cache[0x5f3] | 0xb80142900)
  ;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x410fc075;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x647) = 0x41023075;
  obj[1].tb_jmp_cache[0x63a] = (TranslationBlock *)0x1111111110110222;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0xc5007884448003;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x3244) = 0x1101100001131;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x31dc) = 0x3515f00502010555;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64c) = 0;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x31bc) = 0x4000000010101105;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x31c4) = 0x210221101240000;
  obj[1].tb_jmp_cache[0x634] = (TranslationBlock *)0x1311211102101110;
  obj[1].tb_jmp_cache[0x635] = (TranslationBlock *)0x1111213121232041;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x636) = 0x10011142;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64f) = 0xa200023;
  obj[1].tb_jmp_cache[0x651] = (TranslationBlock *)0x701fe00a;
  obj[1].tb_jmp_cache[0x652] = (TranslationBlock *)0x201fe00a;
  obj[1].tb_jmp_cache[0x653] = (TranslationBlock *)0x711fe07a;
  define_arm_cp_regs_with_opaque_arm((ARMCPU *)obj,cortexa15_cp_reginfo,(void *)0x0);
  return;
}

Assistant:

static void cortex_a7_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V7VE);
    set_feature(&cpu->env, ARM_FEATURE_NEON);
    set_feature(&cpu->env, ARM_FEATURE_THUMB2EE);
    set_feature(&cpu->env, ARM_FEATURE_GENERIC_TIMER);
    set_feature(&cpu->env, ARM_FEATURE_DUMMY_C15_REGS);
    set_feature(&cpu->env, ARM_FEATURE_CBAR_RO);
    set_feature(&cpu->env, ARM_FEATURE_EL2);
    set_feature(&cpu->env, ARM_FEATURE_EL3);
    set_feature(&cpu->env, ARM_FEATURE_PMU);
    cpu->midr = 0x410fc075;
    cpu->reset_fpsid = 0x41023075;
    cpu->isar.mvfr0 = 0x10110222;
    cpu->isar.mvfr1 = 0x11111111;
    cpu->ctr = 0x84448003;
    cpu->reset_sctlr = 0x00c50078;
    cpu->id_pfr0 = 0x00001131;
    cpu->id_pfr1 = 0x00011011;
    cpu->isar.id_dfr0 = 0x02010555;
    cpu->id_afr0 = 0x00000000;
    cpu->isar.id_mmfr0 = 0x10101105;
    cpu->isar.id_mmfr1 = 0x40000000;
    cpu->isar.id_mmfr2 = 0x01240000;
    cpu->isar.id_mmfr3 = 0x02102211;
    /* a7_mpcore_r0p5_trm, page 4-4 gives 0x01101110; but
     * table 4-41 gives 0x02101110, which includes the arm div insns.
     */
    cpu->isar.id_isar0 = 0x02101110;
    cpu->isar.id_isar1 = 0x13112111;
    cpu->isar.id_isar2 = 0x21232041;
    cpu->isar.id_isar3 = 0x11112131;
    cpu->isar.id_isar4 = 0x10011142;
    cpu->isar.dbgdidr = 0x3515f005;
    cpu->clidr = 0x0a200023;
    cpu->ccsidr[0] = 0x701fe00a; /* 32K L1 dcache */
    cpu->ccsidr[1] = 0x201fe00a; /* 32K L1 icache */
    cpu->ccsidr[2] = 0x711fe07a; /* 4096K L2 unified cache */
    define_arm_cp_regs(cpu, cortexa15_cp_reginfo); /* Same as A15 */
}